

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O3

int katherine_get_readout_status(katherine_device_t *device,katherine_readout_status_t *status)

{
  int iVar1;
  char crd [8];
  undefined1 local_20 [8];
  undefined8 local_18;
  
  local_18 = 0x17000000000000;
  iVar1 = katherine_udp_send_exact(&device->control_socket,&local_18,8);
  if (iVar1 == 0) {
    iVar1 = katherine_udp_recv_exact(&device->control_socket,local_20,8);
    if (iVar1 == 0) {
      status->hw_type = local_20._0_4_ & 0xff;
      status->hw_revision = local_20._1_4_ & 0xff;
      status->hw_serial_number = local_20._2_4_ & 0xffff;
      status->fw_version = local_20._4_4_ & 0xffff;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
katherine_get_readout_status(katherine_device_t *device, katherine_readout_status_t *status)
{
    int res;

    res = katherine_cmd_get_readout_status(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    const uint64_t *status_crd = (const uint64_t *) &crd;
    status->hw_type             = EXTRACT(*status_crd, readout_status_crd, hw_type);
    status->hw_revision         = EXTRACT(*status_crd, readout_status_crd, hw_revision);
    status->hw_serial_number    = EXTRACT(*status_crd, readout_status_crd, hw_serial_number);
    status->fw_version          = EXTRACT(*status_crd, readout_status_crd, fw_version);

    return 0;

err:
    return res;
}